

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zx7.h
# Opt level: O3

Optimal * optimize(uchar *input_data,size_t input_size)

{
  ulong uVar1;
  long *plVar2;
  Optimal *pOVar3;
  uchar *puVar4;
  long lVar5;
  long *plVar6;
  bool bVar7;
  int iVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  void *__ptr;
  Optimal *pOVar12;
  ulong uVar13;
  ulong uVar14;
  long *plVar15;
  long lVar16;
  long *plVar17;
  uchar uVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  size_t sVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  
  pvVar9 = calloc(0x881,8);
  pvVar10 = calloc(0x881,8);
  pvVar11 = calloc(0x10000,0x10);
  __ptr = calloc(input_size,0x10);
  sVar22 = input_size;
  pOVar12 = (Optimal *)calloc(input_size,0x10);
  uVar18 = (uchar)sVar22;
  auVar26._0_4_ = -(uint)((int)((ulong)pvVar9 >> 0x20) == 0 && (int)pvVar9 == 0);
  auVar26._4_4_ = -(uint)((int)pvVar10 == 0 && (int)((ulong)pvVar10 >> 0x20) == 0);
  auVar26._8_4_ = -(uint)((int)((ulong)pvVar11 >> 0x20) == 0 && (int)pvVar11 == 0);
  auVar26._12_4_ = -(uint)((int)__ptr == 0 && (int)((ulong)__ptr >> 0x20) == 0);
  iVar8 = movmskps((int)pOVar12,auVar26);
  if ((iVar8 != 0) || (pOVar12 == (Optimal *)0x0)) {
    optimize_cold_1();
    pOVar12 = (Optimal *)output_data;
    puVar4 = output_data + output_index;
    output_index = output_index + 1;
    *puVar4 = uVar18;
    return pOVar12;
  }
  pOVar12->bits = 8;
  if (1 < input_size) {
    sVar22 = 8;
    uVar14 = 1;
    do {
      sVar22 = sVar22 + 9;
      lVar20 = uVar14 * 0x10;
      pOVar12[uVar14].bits = sVar22;
      lVar16 = (ulong)(ushort)(*(ushort *)(input_data + (uVar14 - 1)) << 8 |
                              *(ushort *)(input_data + (uVar14 - 1)) >> 8) * 0x10;
      plVar2 = (long *)((long)pvVar11 + lVar16);
      plVar17 = *(long **)((long)pvVar11 + lVar16 + 8);
      uVar1 = uVar14 + 1;
      if (plVar17 == (long *)0x0) {
        plVar17 = (long *)0x0;
      }
      else {
        lVar16 = uVar14 - *plVar17;
        plVar15 = plVar2;
        if ((int)lVar16 < 0x881) {
          pOVar3 = pOVar12 + uVar14;
          uVar21 = 1;
          plVar6 = plVar17;
          uVar25 = sVar22;
          do {
            plVar15 = plVar6;
            iVar8 = (int)lVar16;
            lVar16 = (long)iVar8;
            uVar13 = 2;
            do {
              if (uVar21 < uVar13) {
                iVar19 = 1;
                if (2 < uVar13) {
                  uVar24 = (int)uVar13 - 1;
                  do {
                    iVar19 = iVar19 + 2;
                    bVar7 = 3 < uVar24;
                    uVar24 = uVar24 >> 1;
                  } while (bVar7);
                }
                uVar23 = (long)(int)(iVar19 + (uint)(0x80 < iVar8) * 4 + 9) +
                         pOVar12[uVar14 - uVar13].bits;
                uVar21 = uVar13;
                sVar22 = uVar25;
                if (uVar23 < uVar25) {
                  pOVar3->bits = uVar23;
                  pOVar3->offset = iVar8;
                  pOVar3->len = (int)uVar13;
                  sVar22 = uVar23;
                  uVar25 = uVar23;
                }
              }
              else {
                lVar5 = *(long *)((long)pvVar10 + lVar16 * 8);
                if (((lVar5 != 0) && (uVar1 == lVar5 + uVar13)) &&
                   (uVar13 = uVar14 - *(long *)((long)pvVar9 + lVar16 * 8), uVar21 <= uVar13)) {
                  uVar13 = uVar21;
                }
              }
            } while (((uVar13 + lVar16 <= uVar14) &&
                     (input_data[uVar14 - uVar13] == input_data[(uVar14 - uVar13) - lVar16])) &&
                    (uVar13 = uVar13 + 1, uVar13 < 0x10001));
            *(ulong *)((long)pvVar9 + lVar16 * 8) = uVar1 - uVar13;
            *(ulong *)((long)pvVar10 + lVar16 * 8) = uVar14;
            plVar6 = (long *)plVar15[1];
            if ((plVar6 == (long *)0x0) || (0xffff < uVar21)) goto LAB_00107ba8;
            lVar16 = uVar14 - *plVar6;
          } while ((int)lVar16 < 0x881);
        }
        plVar15[1] = 0;
        plVar17 = (long *)plVar2[1];
      }
LAB_00107ba8:
      *(ulong *)((long)__ptr + lVar20) = uVar14;
      *(long **)((long)__ptr + lVar20 + 8) = plVar17;
      plVar2[1] = (long)((long)__ptr + lVar20);
      uVar14 = uVar1;
    } while (uVar1 != input_size);
  }
  free(__ptr);
  return pOVar12;
}

Assistant:

Optimal* optimize(unsigned char *input_data, size_t input_size) {
    size_t *min;
    size_t *max;
    Match *matches;
    Match *match_slots;
    Optimal *optimal;
    Match *match;
    int match_index;
    int offset;
    size_t len;
    size_t best_len;
    size_t bits;
    size_t i;

    /* allocate all data structures at once */
    min = (size_t *)calloc(ZX7_MAX_OFFSET+1, sizeof(size_t));
    max = (size_t *)calloc(ZX7_MAX_OFFSET+1, sizeof(size_t));
    matches = (Match *)calloc(256*256, sizeof(Match));
    match_slots = (Match *)calloc(input_size, sizeof(Match));
    optimal = (Optimal *)calloc(input_size, sizeof(Optimal));

    if (!min || !max || !matches || !match_slots || !optimal) {
         fprintf(stderr, "Error: Insufficient memory\n");
         exit(1);
    }

    /* first byte is always literal */
    optimal[0].bits = 8;

    /* process remaining bytes */
    for (i = 1; i < input_size; i++) {

        optimal[i].bits = optimal[i-1].bits + 9;
        match_index = input_data[i-1] << 8 | input_data[i];
        best_len = 1;
        for (match = &matches[match_index]; match->next != NULL && best_len < ZX7_MAX_LEN; match = match->next) {
            offset = i - match->next->index;
            if (offset > ZX7_MAX_OFFSET) {
                match->next = NULL;
                break;
            }

            for (len = 2; len <= ZX7_MAX_LEN; len++) {
                if (len > best_len) {
                    best_len = len;
                    bits = optimal[i-len].bits + count_bits(offset, len);
                    if (optimal[i].bits > bits) {
                        optimal[i].bits = bits;
                        optimal[i].offset = offset;
                        optimal[i].len = len;
                    }
                } else if (i+1 == max[offset]+len && max[offset] != 0) {
                    len = i-min[offset];
                    if (len > best_len) {
                        len = best_len;
                    }
                }
                if (i < offset+len || input_data[i-len] != input_data[i-len-offset]) {
                    break;
                }
            }
            min[offset] = i+1-len;
            max[offset] = i;
        }
        match_slots[i].index = i;
        match_slots[i].next = matches[match_index].next;
        matches[match_index].next = &match_slots[i];
    }

    /* save time by releasing the largest block only, the O.S. will clean everything else later */
    free(match_slots);

    return optimal;
}